

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

errr finish_ui_knowledge_parser(parser *p)

{
  bitflag *pbVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ui_monster_category *puVar4;
  ui_monster_category *puVar5;
  long *p_00;
  long *plVar6;
  char *pcVar7;
  ui_monster_category *tgt;
  long lVar8;
  long lVar9;
  errr eVar10;
  ulong uVar11;
  ulong uVar12;
  
  p_00 = (long *)parser_priv(p);
  if (p_00 == (long *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                  ,0xcfe,"errr finish_ui_knowledge_parser(struct parser *)");
  }
  plVar6 = p_00;
  lVar9 = -0x30;
  uVar12 = 0;
  do {
    uVar11 = uVar12;
    lVar8 = lVar9;
    plVar6 = (long *)*plVar6;
    uVar12 = uVar11 + 1;
    lVar9 = lVar8 + 0x30;
  } while (plVar6 != (long *)0x0);
  if (uVar11 < 0x7fffffff) {
    if (monster_group != (ui_monster_category *)0x0) {
      cleanup_ui_knowledge_parsed_data();
    }
    monster_group = (ui_monster_category *)mem_alloc(lVar8 + 0x60);
    n_monster_group = (wchar_t)uVar12;
    eVar10 = 0;
    pbVar1 = monster_group[1].inc_flags + lVar8 + -0x18;
    pbVar1[0] = '\0';
    pbVar1[1] = '\0';
    pbVar1[2] = '\0';
    pbVar1[3] = '\0';
    pbVar1[4] = '\0';
    pbVar1[5] = '\0';
    pbVar1[6] = '\0';
    pbVar1[7] = '\0';
    pcVar7 = string_make("***Unclassified***");
    puVar5 = monster_group;
    puVar4 = monster_group + 1;
    *(char **)(monster_group[1].inc_flags + lVar8 + -0x10) = pcVar7;
    pbVar1 = puVar5[1].inc_flags + lVar8 + -8;
    pbVar1[0] = '\0';
    pbVar1[1] = '\0';
    pbVar1[2] = '\0';
    pbVar1[3] = '\0';
    pbVar1[4] = '\0';
    pbVar1[5] = '\0';
    pbVar1[6] = '\0';
    pbVar1[7] = '\0';
    flag_wipe(puVar4->inc_flags + lVar8,0xc);
    pbVar1 = monster_group[1].inc_flags + lVar8 + 0xc;
    pbVar1[0] = '\0';
    pbVar1[1] = '\0';
    pbVar1[2] = '\0';
    pbVar1[3] = '\0';
    pbVar1[4] = '\0';
    pbVar1[5] = '\0';
    pbVar1[6] = '\0';
    pbVar1[7] = '\0';
    puVar3 = (undefined8 *)*p_00;
    puVar4 = monster_group;
    while (monster_group = puVar4, puVar3 != (undefined8 *)0x0) {
      puVar2 = (undefined8 *)*puVar3;
      *(bitflag **)(puVar4[-1].inc_flags + lVar9 + -0x18) = puVar4->inc_flags + lVar9 + -0x18;
      *(undefined8 *)(puVar4->inc_flags + lVar9 + -0x40) = puVar3[1];
      *(undefined8 *)(puVar4->inc_flags + lVar9 + -0x38) = puVar3[2];
      flag_copy(puVar4->inc_flags + lVar9 + -0x30,(bitflag *)(puVar3 + 3),0xc);
      puVar4 = monster_group;
      *(undefined4 *)(monster_group->inc_flags + lVar9 + -0x24) =
           *(undefined4 *)((long)puVar3 + 0x24);
      *(undefined4 *)(puVar4->inc_flags + lVar9 + -0x20) = *(undefined4 *)(puVar3 + 5);
      mem_free(puVar3);
      lVar9 = lVar9 + -0x30;
      puVar3 = puVar2;
      puVar4 = monster_group;
    }
  }
  else {
    eVar10 = 0x3b;
    puVar3 = (undefined8 *)*p_00;
    while (puVar3 != (undefined8 *)0x0) {
      puVar2 = (undefined8 *)*puVar3;
      string_free((char *)puVar3[1]);
      mem_free((void *)puVar3[2]);
      mem_free(puVar3);
      puVar3 = puVar2;
    }
  }
  mem_free(p_00);
  parser_destroy(p);
  return eVar10;
}

Assistant:

static errr finish_ui_knowledge_parser(struct parser *p)
{
	struct ui_knowledge_parse_state *s =
		(struct ui_knowledge_parse_state*) parser_priv(p);
	struct ui_monster_category *cursor;
	size_t count;

	assert(s);

	/* Count the number of categories and allocate a flat array for them. */
	count = 0;
	for (cursor = s->categories; cursor; cursor = cursor->next) {
		++count;
	}
	if (count > INT_MAX - 1) {
		/*
		 * The sorting and display logic for monster groups assumes
		 * the number of categories fits in an int.
		 */
		cursor = s->categories;
		while (cursor) {
			struct ui_monster_category *tgt = cursor;

			cursor = cursor->next;
			string_free((char*) tgt->name);
			mem_free(tgt->inc_bases);
			mem_free(tgt);
		}
		mem_free(s);
		parser_destroy(p);
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	}
	if (monster_group) {
		cleanup_ui_knowledge_parsed_data();
	}
	monster_group = mem_alloc((count + 1) * sizeof(*monster_group));
	n_monster_group = (int) (count + 1);

	/* Set the element at the end which receives special treatment. */
	monster_group[count].next = NULL;
	monster_group[count].name = string_make("***Unclassified***");
	monster_group[count].inc_bases = NULL;
	rf_wipe(monster_group[count].inc_flags);
	monster_group[count].n_inc_bases = 0;
	monster_group[count].max_inc_bases = 0;

	/*
	 * Set the others, restoring the order they had in the data file.
	 * Release the memory for the linked list (but not pointed to data
	 * as ownership for that is transferred to the flat array).
	 */
	cursor = s->categories;
	while (cursor) {
		struct ui_monster_category *src = cursor;

		cursor = cursor->next;
		--count;
		monster_group[count].next = monster_group + count + 1;
		monster_group[count].name = src->name;
		monster_group[count].inc_bases = src->inc_bases;
		rf_copy(monster_group[count].inc_flags, src->inc_flags);
		monster_group[count].n_inc_bases = src->n_inc_bases;
		monster_group[count].max_inc_bases = src->max_inc_bases;
		mem_free(src);
	}

	mem_free(s);
	parser_destroy(p);
	return 0;
}